

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O1

int mat_lu(MATRIX A,MATRIX P)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  iVar4 = *(int *)((long)A + -4);
  uVar6 = (ulong)iVar4;
  if (0 < (long)uVar6) {
    uVar5 = 0;
    do {
      *P[uVar5] = (double)(int)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  else {
    uVar7 = 1;
    iVar4 = 0;
    uVar5 = 0;
    do {
      dVar11 = 0.0;
      uVar8 = uVar5;
      uVar9 = uVar5;
      do {
        dVar12 = ABS(A[(int)*P[uVar9]][uVar5]);
        uVar10 = uVar8;
        if (dVar11 < dVar12) {
          uVar10 = uVar9;
        }
        uVar8 = uVar10 & 0xffffffff;
        if (dVar12 <= dVar11) {
          dVar12 = dVar11;
        }
        dVar11 = dVar12;
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
      if (uVar5 != (uVar10 & 0xffffffff)) {
        iVar4 = iVar4 + 1;
        pdVar1 = P[(int)uVar10];
        dVar11 = *P[uVar5];
        *P[uVar5] = *pdVar1;
        *pdVar1 = (double)(int)dVar11;
      }
      pdVar1 = P[uVar5];
      if ((A[(int)*pdVar1][uVar5] == 0.0) && (!NAN(A[(int)*pdVar1][uVar5]))) {
        return -1;
      }
      uVar8 = uVar5 + 1;
      uVar9 = uVar7;
      if (uVar8 < uVar6) {
        do {
          pdVar2 = P[uVar9];
          A[(int)*pdVar2][uVar5] = A[(int)*pdVar2][uVar5] / A[(int)*pdVar1][uVar5];
          uVar10 = uVar7;
          do {
            pdVar3 = A[(int)*pdVar2];
            pdVar3[uVar10] = pdVar3[uVar10] - pdVar3[uVar5] * A[(int)*pdVar1][uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar6);
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar8;
    } while (uVar8 != uVar6);
  }
  return iVar4;
}

Assistant:

int mat_lu( MATRIX A, MATRIX P )
{
	int	i, j, k, n;
	int	maxi, tmp;
	double	c, c1;
	int	p;

	n = MatCol(A);

	for (p=0,i=0; i<n; i++)
		{
		P[i][0] = i;
		}

	for (k=0; k<n; k++)
	{
	/*
	* --- partial pivoting ---
	*/
	for (i=k, maxi=k, c=0.0; i<n; i++)
		{
		c1 = fabs( A[(int)P[i][0]][k] );
		if (c1 > c)
			{
			c = c1;
			maxi = i;
			}
		}

	/*
	*	row exchange, update permutation vector
	*/
	if (k != maxi)
		{
		p++;
		tmp = P[k][0];
		P[k][0] = P[maxi][0];
		P[maxi][0] = tmp;
		}

	/*
	*	suspected singular matrix
	*/
	if ( A[(int)P[k][0]][k] == 0.0 )
		return (-1);

	for (i=k+1; i<n; i++)
		{
		/*
		* --- calculate m(i,j) ---
		*/
		A[(int)P[i][0]][k] = A[(int)P[i][0]][k] / A[(int)P[k][0]][k];

		/*
		* --- elimination ---
		*/
		for (j=k+1; j<n; j++)
			{
			A[(int)P[i][0]][j] -= A[(int)P[i][0]][k] * A[(int)P[k][0]][j];
			}
		}
	}

	return (p);
}